

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O0

void __thiscall Funcdata::printRaw(Funcdata *this,ostream *s)

{
  bool bVar1;
  int4 iVar2;
  RecovError *this_00;
  reference ppVar3;
  SeqNum *sq;
  ostream *poVar4;
  _Self local_68;
  _Base_ptr local_60;
  _Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_> local_58;
  const_iterator iter;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  Funcdata *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  iVar2 = BlockGraph::getSize(&this->bblocks);
  if (iVar2 == 0) {
    bVar1 = PcodeOpBank::empty(&this->obank);
    if (bVar1) {
      iter._M_node._3_1_ = 1;
      this_00 = (RecovError *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"No operations to print",&local_39);
      RecovError::RecovError(this_00,(string *)local_38);
      iter._M_node._3_1_ = 0;
      __cxa_throw(this_00,&RecovError::typeinfo,RecovError::~RecovError);
    }
    std::_Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_>::_Rb_tree_const_iterator
              (&local_58);
    std::operator<<(local_18,"Raw operations: \n");
    local_60 = (_Base_ptr)PcodeOpBank::beginAll(&this->obank);
    local_58._M_node = local_60;
    while( true ) {
      local_68._M_node = (_Base_ptr)PcodeOpBank::endAll(&this->obank);
      bVar1 = std::operator!=(&local_58,&local_68);
      poVar4 = local_18;
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_>::operator*
                         (&local_58);
      sq = PcodeOp::getSeqNum(ppVar3->second);
      poVar4 = ::operator<<(poVar4,sq);
      std::operator<<(poVar4,":\t");
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_>::operator*
                         (&local_58);
      PcodeOp::printRaw(ppVar3->second,local_18);
      std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<std::pair<const_SeqNum,_PcodeOp_*>_>::operator++(&local_58);
    }
  }
  else {
    BlockGraph::printRaw(&this->bblocks,local_18);
  }
  return;
}

Assistant:

void Funcdata::printRaw(ostream &s) const

{
  if (bblocks.getSize()==0) {
    if (obank.empty())
      throw RecovError("No operations to print");
    PcodeOpTree::const_iterator iter;
    s << "Raw operations: \n";
    for(iter=obank.beginAll();iter!=obank.endAll();++iter) {
      s << (*iter).second->getSeqNum() << ":\t";
      (*iter).second->printRaw(s);
      s << endl;
    }
  }
  else
    bblocks.printRaw(s);
}